

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgaussrule.cpp
# Opt level: O2

void __thiscall
TPZGaussRule::ComputingGaussJacobiQuadrature
          (TPZGaussRule *this,int *npoints,longdouble alpha,longdouble beta,
          TPZVec<long_double> *Location,TPZVec<long_double> *Weight)

{
  uint uVar1;
  double dVar2;
  longdouble lVar3;
  ulong uVar4;
  TPZGaussRule *pTVar5;
  longdouble *plVar6;
  longdouble *plVar7;
  TPZGaussRule *pTVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  TPZGaussRule *this_00;
  longdouble in_ST0;
  longdouble lVar13;
  longdouble lVar14;
  longdouble lVar15;
  longdouble lVar16;
  longdouble lVar17;
  longdouble lVar18;
  longdouble lVar19;
  longdouble lVar20;
  longdouble lVar21;
  longdouble lVar22;
  longdouble lVar23;
  longdouble lVar24;
  longdouble lVar25;
  longdouble lVar26;
  longdouble lVar27;
  longdouble lVar28;
  longdouble lVar29;
  longdouble lVar30;
  longdouble x;
  longdouble in_ST1;
  longdouble lVar31;
  longdouble lVar32;
  longdouble lVar33;
  longdouble lVar34;
  longdouble lVar35;
  longdouble lVar36;
  longdouble lVar37;
  longdouble in_ST2;
  longdouble lVar38;
  longdouble lVar39;
  longdouble lVar40;
  longdouble lVar41;
  longdouble lVar42;
  longdouble lVar43;
  longdouble lVar44;
  longdouble lVar45;
  longdouble lVar46;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 uVar47;
  undefined6 uStack_1e0;
  longdouble local_198;
  uint local_17c;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  longdouble *local_168;
  undefined2 uStack_160;
  longdouble *local_158;
  undefined2 uStack_150;
  ulong local_148;
  undefined2 uStack_140;
  longdouble *local_138;
  undefined2 uStack_130;
  TPZGaussRule *local_128;
  undefined2 uStack_120;
  TPZVec<long_double> c;
  TPZVec<long_double> b;
  longdouble local_58;
  longdouble local_48;
  
  b._vptr_TPZVec = (_func_int **)&PTR__TPZVec_016491a8;
  b.fStore = (longdouble *)0x0;
  b.fNElements = 0;
  b.fNAlloc = 0;
  c._vptr_TPZVec = (_func_int **)&PTR__TPZVec_016491a8;
  c.fStore = (longdouble *)0x0;
  c.fNElements = 0;
  c.fNAlloc = 0;
  local_198 = (longdouble)0;
  (*Location->_vptr_TPZVec[2])(Location,(long)*npoints,&local_198);
  local_198 = (longdouble)0;
  (*Weight->_vptr_TPZVec[2])(Weight,(long)*npoints,&local_198);
  local_198 = (longdouble)0;
  TPZVec<long_double>::Resize(&b,(long)*npoints,&local_198);
  local_198 = (longdouble)0;
  TPZVec<long_double>::Resize(&c,(long)*npoints,&local_198);
  lVar13 = -(longdouble)1;
  if (alpha <= lVar13) {
    std::operator<<((ostream *)&std::cerr,
                    "\nJACOBI_COMPUTE - Fatal error!\n  -1.0 < ALPHA is required.\n");
  }
  else {
    if (lVar13 < beta) {
      lVar14 = alpha + beta;
      uVar10 = 0;
      uVar4 = (ulong)(uint)*npoints;
      if (*npoints < 1) {
        uVar4 = uVar10;
      }
      lVar15 = in_ST2;
      for (lVar11 = 0; uVar4 * 0x10 != lVar11; lVar11 = lVar11 + 0x10) {
        iVar12 = (int)uVar10;
        lVar16 = (longdouble)0;
        if (beta - alpha != (longdouble)0 && lVar14 != (longdouble)0) {
          local_16c = iVar12 + 1;
          lVar15 = (longdouble)local_16c + (longdouble)local_16c;
          lVar16 = ((beta - alpha) * lVar14) /
                   ((lVar14 + lVar15 + (longdouble)-2.0) * (lVar15 + lVar14));
          in_ST2 = in_ST1;
          lVar15 = in_ST1;
        }
        *(longdouble *)((long)b.fStore + lVar11) = lVar16;
        if (lVar11 == 0) {
          *c.fStore = (longdouble)0;
        }
        else {
          local_170 = iVar12 + 1;
          lVar15 = (longdouble)iVar12;
          lVar16 = (longdouble)local_170 + (longdouble)local_170;
          lVar17 = lVar16 + (longdouble)-2.0 + lVar14;
          *(longdouble *)((long)c.fStore + lVar11) =
               ((lVar15 + lVar14) * (beta + lVar15) * (alpha + lVar15) * lVar15 * (longdouble)4.0) /
               (lVar17 * lVar17 * (lVar16 + lVar13 + lVar14) * (lVar16 + (longdouble)-3.0 + lVar14))
          ;
          in_ST1 = in_ST0;
          in_ST2 = in_ST0;
          lVar15 = in_ST0;
          local_174 = iVar12;
        }
        uVar10 = (ulong)(iVar12 + 1);
      }
      plVar6 = c.fStore;
      lVar14 = lVar15;
      dVar2 = gamma((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      dVar2 = gamma(dVar2);
      dVar2 = gamma(dVar2);
      lVar13 = (longdouble)1;
      plVar7 = c.fStore;
      for (lVar11 = 2; plVar7 = plVar7 + 1, lVar11 <= *npoints; lVar11 = lVar11 + 1) {
        lVar13 = *plVar7 * lVar13;
      }
      uVar47 = SUB104(lVar13,0);
      uStack_1e0 = (undefined6)((unkuint10)lVar13 >> 0x20);
      exp2l(SUB84(dVar2,0));
      lVar3 = (longdouble)CONCAT64(uStack_1e0,uVar47);
      uVar1 = *npoints;
      this_00 = (TPZGaussRule *)(ulong)uVar1;
      lVar18 = (longdouble)(int)uVar1;
      lVar19 = (longdouble)8.0;
      lVar31 = _DAT_012ba920 + beta;
      local_178 = uVar1 * uVar1;
      lVar20 = (longdouble)local_178;
      lVar38 = _DAT_012ba8f0 + _DAT_012ba8e0 * alpha;
      lVar21 = _DAT_012ba900 * alpha;
      lVar13 = (longdouble)1;
      lVar22 = (_DAT_012ba910 * (lVar18 + (longdouble)-8.0)) / lVar18 + lVar13;
      lVar43 = _DAT_012ba950 * (lVar18 + (longdouble)-8.0);
      lVar23 = _DAT_012ba960 * alpha;
      lVar32 = beta * _DAT_012ba970;
      lVar24 = _DAT_012ba930 + alpha;
      lVar25 = _DAT_012ba940 * alpha;
      lVar16 = (longdouble)1;
      plVar7 = Location->fStore;
      lVar33 = _DAT_012ba980 / (longdouble)(local_178 + 4);
      lVar17 = alpha / lVar18;
      lVar26 = _DAT_012ba990 * lVar17;
      lVar39 = _DAT_012ba9c0 * lVar17 * lVar17 +
               _DAT_012ba9b0 * (beta / lVar18) + _DAT_012ba9a0 * lVar17 + lVar16 +
               _DAT_012ba9d0 * lVar17 * (beta / lVar18);
      lVar34 = _DAT_012ba8f0 + _DAT_012ba8e0 * beta;
      lVar27 = _DAT_012ba900 * beta;
      lVar17 = (longdouble)1;
      lVar28 = _DAT_012ba920 + alpha;
      lVar35 = _DAT_012baa00 + _DAT_012ba9f0 * beta;
      lVar46 = _DAT_012ba9e0 * beta;
      lVar29 = _DAT_012baa10 * (lVar18 + (longdouble)-4.0);
      lVar40 = _DAT_012baa20 * (lVar18 + (longdouble)-4.0);
      _local_158 = CONCAT28((short)((unkuint10)_DAT_012ba900 >> 0x40),plVar7 + -3);
      _local_168 = CONCAT28((short)((unkuint10)lVar22 >> 0x40),plVar7 + -2);
      _local_138 = CONCAT28((short)((unkuint10)_DAT_012ba8e0 >> 0x40),Weight->fStore);
      _local_148 = CONCAT28((short)((unkuint10)_DAT_012ba8f0 >> 0x40),(long)(int)uVar1 - 1U);
      pTVar5 = (TPZGaussRule *)((long)(int)uVar1 - 1U & 0xffffffff);
      uVar9 = 0;
      if (0 < (int)uVar1) {
        uVar9 = uVar1;
      }
      _local_128 = CONCAT28((short)((unkuint10)lVar19 >> 0x40),(ulong)(uVar9 + 1));
      x = (longdouble)0;
      pTVar8 = (TPZGaussRule *)0x1;
      lVar37 = lVar14;
      lVar41 = lVar14;
      lVar44 = lVar14;
      lVar45 = lVar14;
      local_17c = uVar1;
      do {
        if (pTVar8 == local_128) {
          plVar6 = Location->fStore;
          plVar7 = plVar6 + (int)uVar1;
          for (lVar11 = 1; plVar7 = plVar7 + -1, lVar11 <= (int)uVar1 / 2; lVar11 = lVar11 + 1) {
            lVar13 = *plVar6;
            *plVar6 = *plVar7;
            *plVar7 = lVar13;
            plVar6 = plVar6 + 1;
          }
          plVar7 = Weight->fStore;
          plVar6 = plVar7 + (int)uVar1;
          for (lVar11 = 1; plVar6 = plVar6 + -1, lVar11 <= (int)uVar1 / 2; lVar11 = lVar11 + 1) {
            lVar13 = *plVar7;
            *plVar7 = *plVar6;
            *plVar6 = lVar13;
            plVar7 = plVar7 + 1;
          }
          TPZVec<long_double>::~TPZVec(&c);
          TPZVec<long_double>::~TPZVec(&b);
          return;
        }
        iVar12 = (int)pTVar8;
        lVar36 = (lVar39 - ((longdouble)1 + alpha) * (lVar26 / lVar18 + lVar33)) / lVar39;
        if (iVar12 != 1) {
          if (iVar12 == 3) {
            lVar30 = *plVar7 - x;
            lVar36 = ((beta * lVar19) / (lVar20 * lVar31) + lVar13) *
                     (-lVar38 / (lVar21 + lVar13)) * lVar22;
LAB_00c45fc1:
            lVar36 = lVar36 * lVar30;
          }
          else {
            if (iVar12 == 2) {
              lVar30 = (longdouble)1 - x;
              lVar36 = ((lVar32 * (ABS(alpha) * (longdouble)0.25 + lVar13)) / lVar18 + lVar16) *
                       (-lVar24 / ((lVar25 + lVar13) * ((longdouble)1 + alpha))) *
                       (((lVar23 + lVar13) * lVar43) / lVar18 + lVar16);
              goto LAB_00c45fc1;
            }
            if ((long)local_148 <= (long)pTVar8) {
              if (pTVar8 == pTVar5) {
                lVar30 = x - plVar7[(long)&pTVar5[-1].field_0x7d];
                lVar36 = (lVar17 / ((alpha * (longdouble)20.0) /
                                    ((alpha + (longdouble)7.5) * lVar20) + lVar17)) *
                         (lVar17 / (lVar29 / (lVar40 + lVar17) + lVar17)) *
                         ((lVar46 + lVar17) / lVar35);
              }
              else {
                lVar36 = x;
                if (pTVar8 != this_00) goto LAB_00c45fc9;
                lVar30 = x - plVar7[(long)&this_00[-1].field_0x7d];
                lVar36 = (lVar17 / ((lVar19 * alpha) / (lVar28 * lVar20) + lVar17)) *
                         (lVar17 / lVar22) * ((lVar27 + lVar17) / lVar34);
              }
              goto LAB_00c45fc1;
            }
            x = *(longdouble *)((long)local_168 + (long)pTVar8 * 0x10) * (longdouble)3.0 +
                *(longdouble *)((long)local_158 + (long)pTVar8 * 0x10) * (longdouble)-3.0;
            lVar36 = plVar7[(long)&pTVar8[-1].field_0x7c];
          }
          lVar36 = lVar36 + x;
        }
LAB_00c45fc9:
        uVar47 = SUB104(lVar36,0);
        uStack_1e0 = (undefined6)((unkuint10)lVar36 >> 0x20);
        lVar30 = lVar45;
        machinePrecision();
        x = (longdouble)CONCAT64(uStack_1e0,uVar47);
        iVar12 = 0xb;
        lVar36 = lVar37;
        lVar37 = lVar41;
        lVar41 = lVar44;
        lVar44 = lVar45;
        do {
          iVar12 = iVar12 + -1;
          lVar45 = lVar30;
          if (iVar12 == 0) break;
          uVar47 = SUB104(x,0);
          uStack_1e0 = (undefined6)((unkuint10)x >> 0x20);
          JacobiPolinomial(plVar6,this_00,x,(int)&b,alpha,beta,&c,(TPZVec<long_double> *)&local_58,
                           &local_48,(longdouble *)CONCAT44(uVar47,in_stack_fffffffffffffe18));
          lVar42 = lVar36 / local_58;
          x = (longdouble)CONCAT64(uStack_1e0,uVar47) - lVar42;
          lVar36 = lVar37;
          lVar37 = lVar41;
          lVar41 = lVar44;
          lVar45 = lVar44;
          lVar30 = lVar44;
        } while (lVar14 * ((longdouble)1 + ABS(x)) < ABS(lVar42));
        lVar14 = lVar36;
        plVar7[(long)&pTVar8[-1].field_0x7f] = x;
        *(longdouble *)((long)local_138 + -0x10 + (long)pTVar8 * 0x10) =
             (lVar3 * ((in_ST1 * in_ST0) / in_ST2) * lVar15) / (local_48 * local_58);
        pTVar8 = (TPZGaussRule *)((long)&pTVar8->fType + 1);
      } while( true );
    }
    std::operator<<((ostream *)&std::cerr,
                    "\nJACOBI_COMPUTE - Fatal error!\n  -1.0 < BETA is required.\n");
  }
  exit(1);
}

Assistant:

void TPZGaussRule::ComputingGaussJacobiQuadrature(int *npoints,long double alpha, long double beta,TPZVec<long double> &Location,TPZVec<long double> &Weight) {
	// Computing number of points appropriated to the wished order = 2*npoints - 1. Note: If odd we need increment one point more
	long double an, bn;
	TPZVec<long double> b;
	TPZVec<long double> c;
	long double cc, delta, dp2;
	int i;
	long double p1, prod, r1, r2, r3, temp, x0 = 0.0;
	
	Location.Resize((*npoints),0.0L);
	Weight.Resize((*npoints),0.0L);
	
	b.Resize((*npoints),0.0L);
	c.Resize((*npoints),0.0L);
	
	//  This method permit only alpha > -1.0 and beta > -1.0
	if(alpha <= -1.0L) {
		std::cerr << "\nJACOBI_COMPUTE - Fatal error!\n  -1.0 < ALPHA is required.\n";
		std::exit ( 1 );
	}
	if(beta <= -1.0L) {
		std::cerr << "\nJACOBI_COMPUTE - Fatal error!\n  -1.0 < BETA is required.\n";
		std::exit ( 1 );
	}
	
	//  Set the recursion coefficients.
	for(i=1;i<=(*npoints);i++) {
		if(alpha + beta == 0.0L || beta - alpha == 0.0L) {
			b[i-1] = 0.0L;
		}
		else {
			b[i-1] = ( alpha + beta ) * ( beta - alpha ) / 
			( ( alpha + beta + ( 2.0L * ((long double)(i)) ) ) 
             * ( alpha + beta + ( 2.0L * ((long double)(i)) - 2.0L ) ) );
		}
		if(i==1) {
			c[i-1] = 0.0L;
		}
		else {
			c[i-1] = 4.0L * ( ((long double)(i)) - 1.0L ) * ( alpha + ( ((long double)(i)) - 1.0L ) ) * ( beta + ( ((long double)(i)) - 1.0L ) ) 
            * ( alpha + beta + ( ((long double)(i)) - 1.0L ) ) / 
            ( ( alpha + beta + ( 2.0L * ((long double)(i)) - 1.0L ) ) * (std::pow(alpha + beta + (2.0L*((long double)(i)) - 2.0L),2.0L)) 
			 * ( alpha + beta + ( 2.0L * ((long double)(i)) - 3.0L ) ) );
		}
	}
	
	delta = (gamma(alpha + 1.0L) * gamma(beta + 1.0L)) / gamma(alpha + beta + 2.0L);
	
	prod = 1.0L;
	for(i=2;i <= (*npoints);i++)
		prod = prod * c[i-1];
	cc = delta * std::pow( 2.0L, alpha + beta + 1.0L ) * prod;
	
	for(i=1;i<=(*npoints);i++) {
		if(i==1) {
			an = alpha / (long double)((*npoints));
			bn = beta / (long double)((*npoints));
			
			r1 = ( 1.0L + alpha ) * ( 2.78L / ( 4.0L + (long double)((*npoints)*(*npoints))) + 0.768L * an / (long double)((*npoints)));
			r2 = 1.0L + 1.48L * an + 0.96L * bn + 0.452L * an * an + 0.83L * an * bn;
			
			x0 = ( r2 - r1 ) / r2;
		}
		else if(i==2) {
			r1 = ( 4.1L + alpha ) / ( ( 1.0L + alpha ) * ( 1.0L + 0.156L * alpha ) );
			
			r2 = 1.0L + 0.06L * ((long double)((*npoints)) - 8.0L) * (1.0L + 0.12L * alpha) / (long double)((*npoints));
			r3 = 1.0L + 0.012L * beta * (1.0L + 0.25L * fabsl(alpha)) / (long double)((*npoints));
			
			x0 = x0 - r1*r2*r3*(1.0L - x0);
		}
		else if(i==3) {
			r1 = ( 1.67L + 0.28L * alpha ) / ( 1.0L + 0.37L * alpha );
			r2 = 1.0L + 0.22L * ( (long double)((*npoints)) - 8.0L) / (long double)((*npoints));
			r3 = 1.0L + 8.0L * beta / ( ( 6.28L + beta ) * (long double)((*npoints)*(*npoints)));
			
			x0 = x0 - r1 * r2 * r3 * ( Location[0] - x0 );
		}
		else if(i<(*npoints)-1) {
			x0 = 3.0L * Location[i-2] - 3.0L * Location[i-3] + Location[i-4];
		}
		else if(i==(*npoints)-1) {
			r1 = ( 1.0L + 0.235L * beta ) / (0.766L + 0.119L * beta);
			r2 = 1.0L / ( 1.0L + 0.639L * ((long double)((*npoints)) - 4.0L) 
						 / ( 1.0L + 0.71L * ((long double)((*npoints)) - 4.0L)));
			
			r3 = 1.0L / ( 1.0L + 20.0L * alpha / ( ( 7.5L + alpha ) * 
												  (long double)((*npoints)*(*npoints))));
			
			x0 = x0 + r1 * r2 * r3 * ( x0 - Location[i-3] );
		}
		else if(i==(*npoints)) {
			r1 = ( 1.0L + 0.37L * beta ) / ( 1.67L + 0.28L * beta );
			
			r2 = 1.0L / ( 1.0L + 0.22L * ( (long double)((*npoints)) - 8.0L ) 
						 / (long double)((*npoints)));
			
			r3 = 1.0L / ( 1.0L + 8.0L * alpha / 
						 ( ( 6.28L + alpha ) * (long double)((*npoints)*(*npoints))));
			
			x0 = x0 + r1 * r2 * r3 * ( x0 - Location[i-3] );
		}
		
		// Improving the root of the Jacobi polinomial
		long double d;
		long double precision;
		int itera, itera_max = 10;

		precision = machinePrecision();

		for(itera=1;itera<=itera_max;itera++) {
			d = JacobiPolinomial(x0,(*npoints),alpha,beta,b,c,&dp2,&p1);
			d /= dp2;
			x0 = x0 - d;
			if(fabsl(d) <= precision*(fabsl(x0) + 1.0L)) {
				break;
			}
		}
		Location[i-1] = x0;
		Weight[i-1] = cc/(dp2*p1);
	}

	// inverting the position of the points
	for(i=1;i<=(*npoints)/2;i++) {
		temp = Location[i-1];
		Location[i-1] = Location[(*npoints)-i];
		Location[(*npoints)-i] = temp;
	}
	// inverting the position of the weights
	for(i=1;i<=(*npoints)/2;i++) {
		temp = Weight[i-1];
		Weight[i-1] = Weight[(*npoints)-i];
		Weight[(*npoints)-i] = temp;
	}
}